

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::moveAppend
          (QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *this,ShaderDesc *b,ShaderDesc *e
          )

{
  ShaderDesc *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ShaderDesc *in_RDI;
  ShaderDesc *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::begin
                        ((QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> *)0x950847);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QOpenGLProgramBinaryCache::ShaderDesc::ShaderDesc(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->source).d.ptr = (in_RDI->source).d.ptr + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }